

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_sniffer.cpp
# Opt level: O3

SnifferResult * __thiscall
duckdb::CSVSniffer::SniffCSV
          (SnifferResult *__return_storage_ptr__,CSVSniffer *this,bool force_match)

{
  shared_ptr<duckdb::CSVBufferManager,_true> *this_00;
  vector<duckdb::LogicalType,_true> *this_01;
  vector<duckdb::LogicalType,_true> *pvVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this_02;
  size_t __n;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *__x;
  pointer pbVar2;
  SnifferResult *pSVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  CSVBufferManager *pCVar8;
  pointer pCVar9;
  pointer pSVar10;
  CSVErrorHandler *pCVar11;
  ulong uVar12;
  const_reference pvVar13;
  reference pvVar14;
  long *plVar15;
  undefined8 *puVar16;
  vector<duckdb::LogicalType,_true> *pvVar17;
  const_reference pvVar18;
  reference pvVar19;
  InvalidInputException *pIVar20;
  long *plVar21;
  ulong *puVar22;
  undefined8 *puVar23;
  long lVar24;
  undefined7 in_register_00000011;
  string *msg;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *this_03;
  char cVar25;
  undefined8 uVar26;
  ulong uVar27;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_04;
  reference rVar28;
  string __str;
  string type_error;
  undefined8 *local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 *local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8;
  long lStack_1b0;
  ulong *local_1a8;
  long local_1a0;
  ulong local_198;
  long lStack_190;
  undefined4 local_184;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  string *local_160;
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  char *local_138;
  uint local_130;
  char local_128 [16];
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  CSVReaderOptions *local_f8;
  SnifferResult *local_f0;
  string local_e8;
  string local_c8;
  pointer local_a8;
  pointer pLStack_a0;
  pointer local_98;
  pointer local_88;
  pointer pLStack_80;
  pointer local_78;
  vector<bool,_true> *local_68;
  pointer local_60 [3];
  pointer local_48 [3];
  
  local_184 = (undefined4)CONCAT71(in_register_00000011,force_match);
  this_00 = &this->buffer_manager;
  local_f0 = __return_storage_ptr__;
  pCVar8 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(this_00);
  pCVar8->sniffing = true;
  DetectDialect(this);
  pCVar8 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(this_00);
  pCVar9 = unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>,_true>::
           operator->(&pCVar8->file_handle);
  if (pCVar9->compression_type != UNCOMPRESSED) {
    pCVar8 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(this_00);
    bVar5 = CSVBufferManager::IsBlockUnloaded(pCVar8,0);
    if (bVar5) {
      pCVar8 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(this_00);
      CSVBufferManager::ResetBufferManager(pCVar8);
    }
  }
  DetectTypes(this);
  RefineTypes(this);
  DetectHeader(this);
  ReplaceTypes(this);
  pCVar8 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(this_00);
  pCVar9 = unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>,_true>::
           operator->(&pCVar8->file_handle);
  if (pCVar9->compression_type != UNCOMPRESSED) {
    pCVar8 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(this_00);
    CSVBufferManager::ResetBufferManager(pCVar8);
  }
  pCVar8 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(this_00);
  pCVar8->sniffing = false;
  pSVar10 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
            ::operator->(&this->best_candidate);
  pCVar11 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->
                      (&(pSVar10->super_BaseScanner).error_handler);
  bVar5 = CSVErrorHandler::AnyErrors(pCVar11);
  if ((bVar5) && ((this->options->ignore_errors).value == false)) {
    pSVar10 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
              ::operator->(&this->best_candidate);
    pCVar11 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->
                        (&(pSVar10->super_BaseScanner).error_handler);
    CSVErrorHandler::ErrorIfTypeExists(pCVar11,MAXIMUM_LINE_SIZE);
  }
  SetResultOptions(this);
  local_f8 = this->options;
  local_f8->auto_detect = true;
  msg = (string *)&local_f8->sniffer_user_mismatch_error;
  pvVar1 = (this->set_columns).types;
  if ((pvVar1 != (vector<duckdb::LogicalType,_true> *)0x0) &&
     ((pvVar1->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pvVar1->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    local_118[0] = local_108;
    local_160 = msg;
    if ((local_f8->dialect_options).header.value == true) {
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_118,
                 "The Column names set by the user do not match the ones found by the sniffer. \n",
                 "");
      this_02 = (this->set_columns).names;
      if ((long)(this_02->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this_02->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
          (long)(this->names).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->names).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
        bVar5 = true;
        uVar27 = 0;
        while( true ) {
          pvVar1 = (this->set_columns).types;
          if (pvVar1 == (vector<duckdb::LogicalType,_true> *)0x0) {
            uVar12 = 0;
          }
          else {
            uVar12 = ((long)(pvVar1->
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                            .
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar1->
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                            .
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          }
          if (uVar12 <= uVar27) break;
          pvVar13 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](this_02,uVar27);
          pvVar14 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](&this->names,uVar27);
          __n = pvVar13->_M_string_length;
          if ((__n != pvVar14->_M_string_length) ||
             ((__n != 0 &&
              (iVar7 = bcmp((pvVar13->_M_dataplus)._M_p,(pvVar14->_M_dataplus)._M_p,__n), iVar7 != 0
              )))) {
            cVar25 = '\x01';
            if (9 < uVar27) {
              uVar12 = uVar27;
              cVar4 = '\x04';
              do {
                cVar25 = cVar4;
                if (uVar12 < 100) {
                  cVar25 = cVar25 + -2;
                  goto LAB_01506aea;
                }
                if (uVar12 < 1000) {
                  cVar25 = cVar25 + -1;
                  goto LAB_01506aea;
                }
                if (uVar12 < 10000) goto LAB_01506aea;
                bVar5 = 99999 < uVar12;
                uVar12 = uVar12 / 10000;
                cVar4 = cVar25 + '\x04';
              } while (bVar5);
              cVar25 = cVar25 + '\x01';
            }
LAB_01506aea:
            local_138 = local_128;
            ::std::__cxx11::string::_M_construct((ulong)&local_138,cVar25);
            ::std::__detail::__to_chars_10_impl<unsigned_long>(local_138,local_130,uVar27);
            plVar15 = (long *)::std::__cxx11::string::replace
                                        ((ulong)&local_138,0,(char *)0x0,0x1df374d);
            plVar21 = plVar15 + 2;
            if ((long *)*plVar15 == plVar21) {
              local_148 = *plVar21;
              lStack_140 = plVar15[3];
              local_158 = &local_148;
            }
            else {
              local_148 = *plVar21;
              local_158 = (long *)*plVar15;
            }
            local_150 = plVar15[1];
            *plVar15 = (long)plVar21;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            plVar15 = (long *)::std::__cxx11::string::append((char *)&local_158);
            local_1c8 = &local_1b8;
            puVar22 = (ulong *)(plVar15 + 2);
            if ((ulong *)*plVar15 == puVar22) {
              local_1b8 = *puVar22;
              lStack_1b0 = plVar15[3];
            }
            else {
              local_1b8 = *puVar22;
              local_1c8 = (ulong *)*plVar15;
            }
            local_1c0 = plVar15[1];
            *plVar15 = (long)puVar22;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            pvVar13 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ::operator[](this_02,uVar27);
            puVar16 = (undefined8 *)
                      ::std::__cxx11::string::_M_append
                                ((char *)&local_1c8,(ulong)(pvVar13->_M_dataplus)._M_p);
            local_208 = &local_1f8;
            puVar23 = puVar16 + 2;
            if ((undefined8 *)*puVar16 == puVar23) {
              local_1f8 = *puVar23;
              uStack_1f0 = puVar16[3];
            }
            else {
              local_1f8 = *puVar23;
              local_208 = (undefined8 *)*puVar16;
            }
            local_200 = puVar16[1];
            *puVar16 = puVar23;
            puVar16[1] = 0;
            *(undefined1 *)(puVar16 + 2) = 0;
            plVar15 = (long *)::std::__cxx11::string::append((char *)&local_208);
            local_1a8 = &local_198;
            puVar22 = (ulong *)(plVar15 + 2);
            if ((ulong *)*plVar15 == puVar22) {
              local_198 = *puVar22;
              lStack_190 = plVar15[3];
            }
            else {
              local_198 = *puVar22;
              local_1a8 = (ulong *)*plVar15;
            }
            local_1a0 = plVar15[1];
            *plVar15 = (long)puVar22;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            pvVar14 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ::operator[](&this->names,uVar27);
            puVar16 = (undefined8 *)
                      ::std::__cxx11::string::_M_append
                                ((char *)&local_1a8,(ulong)(pvVar14->_M_dataplus)._M_p);
            local_1e8 = &local_1d8;
            puVar23 = puVar16 + 2;
            if ((undefined8 *)*puVar16 == puVar23) {
              local_1d8 = *puVar23;
              uStack_1d0 = puVar16[3];
            }
            else {
              local_1d8 = *puVar23;
              local_1e8 = (undefined8 *)*puVar16;
            }
            local_1e0 = puVar16[1];
            *puVar16 = puVar23;
            puVar16[1] = 0;
            *(undefined1 *)(puVar16 + 2) = 0;
            plVar15 = (long *)::std::__cxx11::string::append((char *)&local_1e8);
            local_180 = &local_170;
            plVar21 = plVar15 + 2;
            if ((long *)*plVar15 == plVar21) {
              local_170 = *plVar21;
              lStack_168 = plVar15[3];
            }
            else {
              local_170 = *plVar21;
              local_180 = (long *)*plVar15;
            }
            local_178 = plVar15[1];
            *plVar15 = (long)plVar21;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_118,(ulong)local_180);
            if (local_180 != &local_170) {
              operator_delete(local_180);
            }
            if (local_1e8 != &local_1d8) {
              operator_delete(local_1e8);
            }
            if (local_1a8 != &local_198) {
              operator_delete(local_1a8);
            }
            if (local_208 != &local_1f8) {
              operator_delete(local_208);
            }
            if (local_1c8 != &local_1b8) {
              operator_delete(local_1c8);
            }
            if (local_158 != &local_148) {
              operator_delete(local_158);
            }
            if (local_138 != local_128) {
              operator_delete(local_138);
            }
            bVar5 = false;
          }
          uVar27 = uVar27 + 1;
        }
        if (!bVar5) {
          ::std::__cxx11::string::_M_append((char *)local_160,(ulong)local_118[0]);
        }
      }
      if (local_118[0] != local_108) {
        operator_delete(local_118[0]);
      }
    }
    local_118[0] = local_108;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_118,
               "The Column types set by the user do not match the ones found by the sniffer. \n","")
    ;
    pvVar1 = (this->set_columns).types;
    if (pvVar1 == (vector<duckdb::LogicalType,_true> *)0x0) {
      lVar24 = 0;
    }
    else {
      lVar24 = ((long)(pvVar1->
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(pvVar1->
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    }
    if (((long)(this->detected_types).
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)(this->detected_types).
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - lVar24 == 0) {
      this_01 = &this->detected_types;
      local_68 = &this->manually_set;
      bVar5 = true;
      uVar27 = 0;
      pvVar17 = pvVar1;
      while( true ) {
        if (pvVar17 == (vector<duckdb::LogicalType,_true> *)0x0) {
          uVar12 = 0;
        }
        else {
          uVar12 = ((long)(pvVar17->
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar17->
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        }
        if (uVar12 <= uVar27) break;
        pvVar18 = vector<duckdb::LogicalType,_true>::operator[](pvVar1,uVar27);
        pvVar19 = vector<duckdb::LogicalType,_true>::operator[](this_01,uVar27);
        bVar6 = LogicalType::operator==(pvVar18,pvVar19);
        if (!bVar6) {
          cVar25 = '\x01';
          if (9 < uVar27) {
            uVar12 = uVar27;
            cVar4 = '\x04';
            do {
              cVar25 = cVar4;
              if (uVar12 < 100) {
                cVar25 = cVar25 + -2;
                goto LAB_01506fa5;
              }
              if (uVar12 < 1000) {
                cVar25 = cVar25 + -1;
                goto LAB_01506fa5;
              }
              if (uVar12 < 10000) goto LAB_01506fa5;
              bVar5 = 99999 < uVar12;
              uVar12 = uVar12 / 10000;
              cVar4 = cVar25 + '\x04';
            } while (bVar5);
            cVar25 = cVar25 + '\x01';
          }
LAB_01506fa5:
          local_138 = local_128;
          ::std::__cxx11::string::_M_construct((ulong)&local_138,cVar25);
          ::std::__detail::__to_chars_10_impl<unsigned_long>(local_138,local_130,uVar27);
          puVar16 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x1df374d);
          local_158 = &local_148;
          plVar15 = puVar16 + 2;
          if ((long *)*puVar16 == plVar15) {
            local_148 = *plVar15;
            lStack_140 = puVar16[3];
          }
          else {
            local_148 = *plVar15;
            local_158 = (long *)*puVar16;
          }
          local_150 = puVar16[1];
          *puVar16 = plVar15;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_158);
          local_1c8 = &local_1b8;
          puVar22 = puVar16 + 2;
          if ((ulong *)*puVar16 == puVar22) {
            local_1b8 = *puVar22;
            lStack_1b0 = puVar16[3];
          }
          else {
            local_1b8 = *puVar22;
            local_1c8 = (ulong *)*puVar16;
          }
          local_1c0 = puVar16[1];
          *puVar16 = puVar22;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          pvVar18 = vector<duckdb::LogicalType,_true>::operator[](pvVar1,uVar27);
          LogicalType::ToString_abi_cxx11_(&local_c8,pvVar18);
          uVar12 = 0xf;
          if (local_1c8 != &local_1b8) {
            uVar12 = local_1b8;
          }
          if (uVar12 < local_c8._M_string_length + local_1c0) {
            uVar26 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              uVar26 = local_c8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar26 < local_c8._M_string_length + local_1c0) goto LAB_01507111;
            puVar16 = (undefined8 *)
                      ::std::__cxx11::string::replace
                                ((ulong)&local_c8,0,(char *)0x0,(ulong)local_1c8);
          }
          else {
LAB_01507111:
            puVar16 = (undefined8 *)
                      ::std::__cxx11::string::_M_append
                                ((char *)&local_1c8,(ulong)local_c8._M_dataplus._M_p);
          }
          local_208 = &local_1f8;
          puVar23 = puVar16 + 2;
          if ((undefined8 *)*puVar16 == puVar23) {
            local_1f8 = *puVar23;
            uStack_1f0 = puVar16[3];
          }
          else {
            local_1f8 = *puVar23;
            local_208 = (undefined8 *)*puVar16;
          }
          local_200 = puVar16[1];
          *puVar16 = puVar23;
          puVar16[1] = 0;
          *(undefined1 *)puVar23 = 0;
          puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_208);
          local_1a8 = &local_198;
          puVar22 = puVar16 + 2;
          if ((ulong *)*puVar16 == puVar22) {
            local_198 = *puVar22;
            lStack_190 = puVar16[3];
          }
          else {
            local_198 = *puVar22;
            local_1a8 = (ulong *)*puVar16;
          }
          local_1a0 = puVar16[1];
          *puVar16 = puVar22;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          pvVar19 = vector<duckdb::LogicalType,_true>::operator[](this_01,uVar27);
          LogicalType::ToString_abi_cxx11_(&local_e8,pvVar19);
          uVar12 = 0xf;
          if (local_1a8 != &local_198) {
            uVar12 = local_198;
          }
          if (uVar12 < local_e8._M_string_length + local_1a0) {
            uVar26 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              uVar26 = local_e8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar26 < local_e8._M_string_length + local_1a0) goto LAB_0150723a;
            puVar16 = (undefined8 *)
                      ::std::__cxx11::string::replace
                                ((ulong)&local_e8,0,(char *)0x0,(ulong)local_1a8);
          }
          else {
LAB_0150723a:
            puVar16 = (undefined8 *)
                      ::std::__cxx11::string::_M_append
                                ((char *)&local_1a8,(ulong)local_e8._M_dataplus._M_p);
          }
          local_1e8 = &local_1d8;
          puVar23 = puVar16 + 2;
          if ((undefined8 *)*puVar16 == puVar23) {
            local_1d8 = *puVar23;
            uStack_1d0 = puVar16[3];
          }
          else {
            local_1d8 = *puVar23;
            local_1e8 = (undefined8 *)*puVar16;
          }
          local_1e0 = puVar16[1];
          *puVar16 = puVar23;
          puVar16[1] = 0;
          *(undefined1 *)puVar23 = 0;
          puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_1e8);
          local_180 = &local_170;
          plVar15 = puVar16 + 2;
          if ((long *)*puVar16 == plVar15) {
            local_170 = *plVar15;
            lStack_168 = puVar16[3];
          }
          else {
            local_170 = *plVar15;
            local_180 = (long *)*puVar16;
          }
          local_178 = puVar16[1];
          *puVar16 = plVar15;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_118,(ulong)local_180);
          if (local_180 != &local_170) {
            operator_delete(local_180);
          }
          if (local_1e8 != &local_1d8) {
            operator_delete(local_1e8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          if (local_1a8 != &local_198) {
            operator_delete(local_1a8);
          }
          if (local_208 != &local_1f8) {
            operator_delete(local_208);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
          if (local_1c8 != &local_1b8) {
            operator_delete(local_1c8);
          }
          if (local_158 != &local_148) {
            operator_delete(local_158);
          }
          if (local_138 != local_128) {
            operator_delete(local_138);
          }
          pvVar18 = vector<duckdb::LogicalType,_true>::operator[](pvVar1,uVar27);
          pvVar19 = vector<duckdb::LogicalType,_true>::operator[](this_01,uVar27);
          if (pvVar19 != pvVar18) {
            pvVar19->id_ = pvVar18->id_;
            pvVar19->physical_type_ = pvVar18->physical_type_;
            shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                      (&pvVar19->type_info_,&pvVar18->type_info_);
          }
          rVar28 = vector<bool,_true>::get<true>(local_68,uVar27);
          *rVar28._M_p = *rVar28._M_p | rVar28._M_mask;
          bVar5 = false;
        }
        uVar27 = uVar27 + 1;
        pvVar17 = (this->set_columns).types;
      }
      if (!bVar5) {
        ::std::__cxx11::string::_M_append((char *)local_160,(ulong)local_118[0]);
      }
    }
    if ((char)local_184 == '\x01' && (local_f8->sniffer_user_mismatch_error)._M_string_length != 0)
    {
      pIVar20 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      InvalidInputException::InvalidInputException(pIVar20,local_160);
      __cxa_throw(pIVar20,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::vector<bool,_std::allocator<bool>_>::operator=
              (&(this->options->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>,
               &(this->manually_set).super_vector<bool,_std::allocator<bool>_>);
    msg = local_160;
    if (local_118[0] != local_108) {
      operator_delete(local_118[0]);
      msg = local_160;
    }
  }
  if ((char)local_184 == '\x01' && (local_f8->sniffer_user_mismatch_error)._M_string_length != 0) {
    pIVar20 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    InvalidInputException::InvalidInputException(pIVar20,msg);
    __cxa_throw(pIVar20,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::vector<bool,_std::allocator<bool>_>::operator=
            (&(this->options->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>,
             &(this->manually_set).super_vector<bool,_std::allocator<bool>_>);
  __x = &((this->set_columns).types)->
         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>;
  if ((__x == (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)0x0) ||
     ((__x->super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (__x->super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    this_03 = (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_a8;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (this_03,&(this->detected_types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    this_04 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(this_04,&(this->names).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
    (local_f0->return_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
    .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = local_a8;
    (local_f0->return_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
    .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = pLStack_a0;
    (local_f0->return_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
    .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_98;
    local_a8 = (pointer)0x0;
    pLStack_a0 = (pointer)0x0;
    local_98 = (pointer)0x0;
    local_48[0] = local_60[0];
  }
  else {
    this_03 = (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_88;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector(this_03,__x);
    this_04 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_48;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(this_04,&((this->set_columns).names)->
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
    (local_f0->return_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
    .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = local_88;
    (local_f0->return_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
    .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = pLStack_80;
    (local_f0->return_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
    .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_78;
    local_88 = (pointer)0x0;
    pLStack_80 = (pointer)0x0;
    local_78 = (pointer)0x0;
  }
  pSVar3 = local_f0;
  (local_f0->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_48[0];
  pbVar2 = *(pointer *)(this_04 + 0x10);
  (local_f0->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(this_04 + 8);
  (local_f0->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar2;
  *(undefined8 *)this_04 = 0;
  *(undefined8 *)(this_04 + 8) = 0;
  *(undefined8 *)(this_04 + 0x10) = 0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this_04);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(this_03);
  return pSVar3;
}

Assistant:

SnifferResult CSVSniffer::SniffCSV(const bool force_match) {
	buffer_manager->sniffing = true;
	// 1. Dialect Detection
	DetectDialect();
	if (buffer_manager->file_handle->compression_type != FileCompressionType::UNCOMPRESSED &&
	    buffer_manager->IsBlockUnloaded(0)) {
		buffer_manager->ResetBufferManager();
	}
	// 2. Type Detection
	DetectTypes();
	// 3. Type Refinement
	RefineTypes();
	// 4. Header Detection
	DetectHeader();
	// 5. Type Replacement
	ReplaceTypes();

	// We reset the buffer for compressed files
	// This is done because we can't easily seek on compressed files, if a buffer goes out of scope we must read from
	// the start
	if (buffer_manager->file_handle->compression_type != FileCompressionType::UNCOMPRESSED) {
		buffer_manager->ResetBufferManager();
	}
	buffer_manager->sniffing = false;
	if (best_candidate->error_handler->AnyErrors() && !options.ignore_errors.GetValue()) {
		best_candidate->error_handler->ErrorIfTypeExists(MAXIMUM_LINE_SIZE);
	}
	D_ASSERT(best_sql_types_candidates_per_column_idx.size() == names.size());
	// We are done, Set the CSV Options in the reference. Construct and return the result.
	SetResultOptions();
	options.auto_detect = true;
	// Check if everything matches
	auto &error = options.sniffer_user_mismatch_error;
	if (set_columns.IsSet()) {
		bool match = true;
		// Columns and their types were set, let's validate they match
		if (options.dialect_options.header.GetValue()) {
			// If the header exists it should match
			string header_error = "The Column names set by the user do not match the ones found by the sniffer. \n";
			auto &set_names = *set_columns.names;
			if (set_names.size() == names.size()) {
				for (idx_t i = 0; i < set_columns.Size(); i++) {
					if (set_names[i] != names[i]) {
						header_error += "Column at position: " + to_string(i) + ", Set name: " + set_names[i] +
						                ", Sniffed Name: " + names[i] + "\n";
						match = false;
					}
				}
			}

			if (!match) {
				error += header_error;
			}
		}
		match = true;
		string type_error = "The Column types set by the user do not match the ones found by the sniffer. \n";
		auto &set_types = *set_columns.types;
		if (detected_types.size() == set_columns.Size()) {
			for (idx_t i = 0; i < set_columns.Size(); i++) {
				if (set_types[i] != detected_types[i]) {
					type_error += "Column at position: " + to_string(i) + " Set type: " + set_types[i].ToString() +
					              " Sniffed type: " + detected_types[i].ToString() + "\n";
					detected_types[i] = set_types[i];
					manually_set[i] = true;
					match = false;
				}
			}
		}

		if (!match) {
			error += type_error;
		}

		if (!error.empty() && force_match) {
			throw InvalidInputException(error);
		}
		options.was_type_manually_set = manually_set;
	}
	if (!error.empty() && force_match) {
		throw InvalidInputException(error);
	}
	options.was_type_manually_set = manually_set;
	if (set_columns.IsSet()) {
		return SnifferResult(*set_columns.types, *set_columns.names);
	}
	return SnifferResult(detected_types, names);
}